

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::GenericPackage::Copy(GenericPackage *this,GenericPackage *rhs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  (this->PackageUID).super_Identifier<32U>.m_HasValue =
       (rhs->PackageUID).super_Identifier<32U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->PackageUID).super_Identifier<32U>.m_Value + 8);
  uVar2 = *(undefined8 *)((rhs->PackageUID).super_Identifier<32U>.m_Value + 0x10);
  uVar3 = *(undefined8 *)((rhs->PackageUID).super_Identifier<32U>.m_Value + 0x18);
  *(undefined8 *)(this->PackageUID).super_Identifier<32U>.m_Value =
       *(undefined8 *)(rhs->PackageUID).super_Identifier<32U>.m_Value;
  *(undefined8 *)((this->PackageUID).super_Identifier<32U>.m_Value + 8) = uVar1;
  *(undefined8 *)((this->PackageUID).super_Identifier<32U>.m_Value + 0x10) = uVar2;
  *(undefined8 *)((this->PackageUID).super_Identifier<32U>.m_Value + 0x18) = uVar3;
  std::__cxx11::string::_M_assign((string *)&(this->Name).m_property.super_string);
  (this->Name).m_has_value = (rhs->Name).m_has_value;
  Kumu::Timestamp::operator=(&this->PackageCreationDate,&rhs->PackageCreationDate);
  Kumu::Timestamp::operator=(&this->PackageModifiedDate,&rhs->PackageModifiedDate);
  std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::operator=
            (&(this->Tracks).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
              super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>,
             &(rhs->Tracks).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
              super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>);
  return;
}

Assistant:

void
GenericPackage::Copy(const GenericPackage& rhs)
{
  InterchangeObject::Copy(rhs);
  PackageUID = rhs.PackageUID;
  Name = rhs.Name;
  PackageCreationDate = rhs.PackageCreationDate;
  PackageModifiedDate = rhs.PackageModifiedDate;
  Tracks = rhs.Tracks;
}